

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PostDecTestUint16(void)

{
  bool expected;
  unsigned_short t;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar1;
  long lVar2;
  allocator local_51;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si
  ;
  
  for (lVar2 = 4; lVar2 != 0x3a; lVar2 = lVar2 + 6) {
    t = *(unsigned_short *)(&UNK_00159dbc + lVar2);
    si.m_int = t;
    SVar1 = SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            ::operator--(&si,0);
    expected = *(bool *)((long)&dec_uint16 + lVar2);
    if ((SVar1.m_int == t) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case dec_uint16 throw (2): ",&local_51);
      err_msg<unsigned_short>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PostDecTestUint16()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint16); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint16_t> si(dec_uint16[i].x);
			SafeInt<std::uint16_t> vv = si--;

			if(vv != dec_uint16[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint16[i].fExpected )
		{
			err_msg( "Error in case dec_uint16 throw (2): ", dec_uint16[i].x, dec_uint16[i].fExpected );
		}
	}
}